

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generator.cpp
# Opt level: O2

string * __thiscall
libcellml::Generator::GeneratorImpl::newLineIfNeeded_abi_cxx11_
          (string *__return_storage_ptr__,GeneratorImpl *this)

{
  char *__s;
  allocator<char> local_9;
  
  __s = "\n";
  if ((this->mCode)._M_string_length == 0) {
    __s = "";
  }
  std::__cxx11::string::string<std::allocator<char>>((string *)__return_storage_ptr__,__s,&local_9);
  return __return_storage_ptr__;
}

Assistant:

std::string Generator::GeneratorImpl::newLineIfNeeded()
{
    return mCode.empty() ? "" : "\n";
}